

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_3dfloors.cpp
# Opt level: O2

void P_RecalculateAttachedLights(sector_t *sector)

{
  extsector_t *peVar1;
  uint i;
  ulong uVar2;
  
  peVar1 = sector->e;
  for (uVar2 = 0; uVar2 < (peVar1->XFloor).attached.Count; uVar2 = uVar2 + 1) {
    P_RecalculateLights((peVar1->XFloor).attached.Array[uVar2]);
  }
  P_RecalculateLights(sector);
  return;
}

Assistant:

void P_RecalculateAttachedLights(sector_t *sector)
{
	extsector_t::xfloor &x = sector->e->XFloor;

	for(unsigned int i=0; i<x.attached.Size(); i++)
	{
		P_RecalculateLights(x.attached[i]);
	}
	P_RecalculateLights(sector);
}